

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::Get(Mat *this,int min_m,int max_m,int min_n,int max_n)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  long lVar5;
  int in_R9D;
  Mat MVar6;
  
  Mat(this,(min_n - max_m) + 1,(in_R9D - max_n) + 1);
  pdVar2 = this->v_;
  MVar6.v_ = (double *)(long)in_R9D;
  lVar4 = 0;
  for (; max_m <= min_n; max_m = max_m + 1) {
    lVar4 = (long)(int)lVar4;
    iVar1 = *(int *)(CONCAT44(in_register_00000034,min_m) + 4);
    lVar3 = *(long *)(CONCAT44(in_register_00000034,min_m) + 8);
    for (lVar5 = (long)max_n; lVar5 <= (long)MVar6.v_; lVar5 = lVar5 + 1) {
      pdVar2[lVar4] = *(double *)((long)(iVar1 * max_m) * 8 + lVar3 + lVar5 * 8);
      lVar4 = lVar4 + 1;
    }
  }
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

Mat Mat::Get(const int min_m, const int max_m, const int min_n, const int max_n) const
{
	Mat getmat(max_m-min_m+1,max_n-min_n+1);
	int i, im , in;  
	for(i = 0 , im=min_m; im<max_m+1;  ++im)
		for(in=min_n; in<max_n+1; ++i, ++in)		
			getmat.v_[i]=v_[im*n_cols_+in];
	return getmat;
}